

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall
QHybrid::QHybrid(QHybrid *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,
                Qheur_t QheurTypeFirstTimeSteps,QFunctionJointBeliefInterface *QlastTimeSteps,
                size_t horizonLastTimeSteps)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  E *this_00;
  
  this->super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005d7bb0;
  QFunctionForDecPOMDP::QFunctionForDecPOMDP
            ((QFunctionForDecPOMDP *)&this->field_0x68,&PTR_construction_vtable_128__005d7a20,pu);
  QFunctionJAOHInterface::QFunctionJAOHInterface
            (&this->super_QFunctionJAOHInterface,&PTR_PTR_005d79e0);
  this->super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5d7880;
  *(undefined8 *)&this->field_0x68 = 0x5d7970;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.size_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_ = (pointer)0x0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size1_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size2_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_QTableInterface._vptr_QTableInterface =
       (_func_int **)&PTR_Get_00604bb0;
  this->_m_QheurTypeFirstTS = QheurTypeFirstTimeSteps;
  this->_m_QlastTimeSteps = QlastTimeSteps;
  this->_m_horizonLastTimeSteps = horizonLastTimeSteps;
  lVar2 = *(long *)&this->field_0x70;
  if (lVar2 == 0) {
    lVar2 = *(long *)&this->field_0x78;
  }
  uVar1 = *(ulong *)(lVar2 + 0x18);
  this->_m_optimizedHorLast = false;
  this->_m_initialized = false;
  sVar3 = uVar1 - horizonLastTimeSteps;
  this->_m_horizonFirstTimeSteps = sVar3;
  if (horizonLastTimeSteps <= uVar1 && sVar3 != 0) {
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

QHybrid::QHybrid(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
                 Qheur_t QheurTypeFirstTimeSteps,
                 QFunctionJointBeliefInterface *QlastTimeSteps,
                 size_t horizonLastTimeSteps) : 
    QFunctionForDecPOMDP(pu), //virtual base first
    _m_QheurTypeFirstTS(QheurTypeFirstTimeSteps),
    _m_QlastTimeSteps(QlastTimeSteps),
    _m_horizonLastTimeSteps(horizonLastTimeSteps),
    _m_horizonFirstTimeSteps(GetPU()->GetHorizon()-horizonLastTimeSteps),
    _m_optimizedHorLast(false),
    _m_initialized(false)
{
    if(horizonLastTimeSteps>=GetPU()->GetHorizon())
        throw(E("QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon"));
}